

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

fft_plan *
fft_plan_dft_1d(fft_plan *__return_storage_ptr__,int n,fft_complex *in,fft_complex *out,int sign,
               uint flags)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  int *ip;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = 0xffffffffffffffff;
  uVar5 = (long)((n * 5) / 4) << 3;
  if (n < 0) {
    uVar5 = uVar1;
  }
  uVar4 = (ulong)(uint)n << 2;
  if (n < 0) {
    uVar4 = uVar1;
  }
  uVar2 = (long)(n * 2) << 3;
  if (n < 0) {
    uVar2 = uVar1;
  }
  *(undefined8 *)&__return_storage_ptr__->flags = 0;
  __return_storage_ptr__->n = n;
  __return_storage_ptr__->c_in = in;
  __return_storage_ptr__->c_out = out;
  __return_storage_ptr__->sign = sign;
  __return_storage_ptr__->flags = flags;
  __return_storage_ptr__->in = (double *)0x0;
  __return_storage_ptr__->out = (double *)0x0;
  pdVar3 = (double *)operator_new__(uVar2);
  __return_storage_ptr__->input = pdVar3;
  ip = (int *)operator_new__(uVar4);
  __return_storage_ptr__->ip = ip;
  pdVar3 = (double *)operator_new__(uVar5);
  __return_storage_ptr__->w = pdVar3;
  *ip = 0;
  makewt(n >> 1,ip,pdVar3);
  return __return_storage_ptr__;
}

Assistant:

fft_plan fft_plan_dft_1d(int n, fft_complex *in, fft_complex *out, int sign,
    unsigned int flags) {
  void makewt(int nw, int *ip, double *w);

  fft_plan output = {0};
  output.n = n;
  output.in = NULL;
  output.c_in = in;
  output.out = NULL;
  output.c_out = out;
  output.sign = sign;
  output.flags = flags;
  output.input = new double[n * 2];
  output.ip = new int[n];
  output.w = new double[n * 5 / 4];

  output.ip[0] = 0;
  makewt(output.n >> 1, output.ip, output.w);
  return output;
}